

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrecursive_maximum_likelihood_parameter_generation.cc
# Opt level: O3

void __thiscall
sptk::NonrecursiveMaximumLikelihoodParameterGeneration::
NonrecursiveMaximumLikelihoodParameterGeneration
          (NonrecursiveMaximumLikelihoodParameterGeneration *this,int num_order,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *window_coefficients,bool use_magic_number,double magic_number)

{
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *this_00;
  const_iterator __position;
  iterator __position_00;
  int iVar1;
  ulong uVar2;
  pointer this_01;
  initializer_list<double> __l;
  allocator_type local_59;
  double local_58;
  vector<double,_std::allocator<double>_> local_50;
  double local_38;
  
  this->_vptr_NonrecursiveMaximumLikelihoodParameterGeneration =
       (_func_int **)&PTR__NonrecursiveMaximumLikelihoodParameterGeneration_0011fa30;
  this->num_order_ = num_order;
  this_00 = &this->window_coefficients_;
  local_58 = magic_number;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(this_00,window_coefficients);
  this->use_magic_number_ = use_magic_number;
  this->magic_number_ = local_58;
  this->is_valid_ = true;
  this->max_half_window_width_ = 0;
  if (num_order < 0) {
    this->is_valid_ = false;
  }
  else {
    __position._M_current =
         (this_00->
         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
    local_38 = 1.0;
    __l._M_len = 1;
    __l._M_array = &local_38;
    std::vector<double,_std::allocator<double>_>::vector(&local_50,__l,&local_59);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::_M_insert_rval(this_00,__position,&local_50);
    if (local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    this_01 = (this->window_coefficients_).
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (this_01 !=
        (this->window_coefficients_).
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        __position_00._M_current =
             (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        uVar2 = (long)__position_00._M_current -
                (long)(this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start;
        if (((uint)uVar2 >> 3 & 1) == 0) {
          local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          if (__position_00._M_current ==
              (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      (this_01,__position_00,(double *)&local_50);
          }
          else {
            *__position_00._M_current = 0.0;
            (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish = __position_00._M_current + 1;
          }
        }
        iVar1 = (int)(((uint)(uVar2 >> 0x22) & 1) + (int)(uVar2 >> 3)) >> 1;
        if (this->max_half_window_width_ < iVar1) {
          this->max_half_window_width_ = iVar1;
        }
        this_01 = this_01 + 1;
      } while (this_01 !=
               (this->window_coefficients_).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  return;
}

Assistant:

NonrecursiveMaximumLikelihoodParameterGeneration::
    NonrecursiveMaximumLikelihoodParameterGeneration(
        int num_order,
        const std::vector<std::vector<double> >& window_coefficients,
        bool use_magic_number, double magic_number)
    : num_order_(num_order),
      window_coefficients_(window_coefficients),
      use_magic_number_(use_magic_number),
      magic_number_(magic_number),
      is_valid_(true),
      max_half_window_width_(0) {
  if (num_order < 0) {
    is_valid_ = false;
    return;
  }

  // Insert window coeffients for static components.
  window_coefficients_.insert(window_coefficients_.begin(), {1.0});

  for (std::vector<std::vector<double> >::iterator itr(
           window_coefficients_.begin());
       itr != window_coefficients_.end(); ++itr) {
    const int window_width(static_cast<int>(itr->size()));
    if (0 == window_width % 2) {
      itr->push_back(0.0);
    }
    const int half_window_width(window_width / 2);
    if (max_half_window_width_ < half_window_width) {
      max_half_window_width_ = half_window_width;
    }
  }
}